

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O3

path_alias * __thiscall
xray_re::xr_file_system::add_path_alias(xr_file_system *this,string *path,string *root,string *add)

{
  pointer *ppppVar1;
  iterator __position;
  size_type sVar2;
  path_alias *ppVar3;
  path_alias *new_pa;
  path_alias *local_30;
  
  ppVar3 = find_path_alias(this,(path->_M_dataplus)._M_p);
  if (ppVar3 == (path_alias *)0x0) {
    local_30 = (path_alias *)operator_new(0x80);
    (local_30->path)._M_dataplus._M_p = (pointer)&(local_30->path).field_2;
    (local_30->path)._M_string_length = 0;
    (local_30->path).field_2._M_local_buf[0] = '\0';
    (local_30->root)._M_dataplus._M_p = (pointer)&(local_30->root).field_2;
    (local_30->root)._M_string_length = 0;
    (local_30->root).field_2._M_local_buf[0] = '\0';
    (local_30->filter)._M_dataplus._M_p = (pointer)&(local_30->filter).field_2;
    (local_30->filter)._M_string_length = 0;
    (local_30->filter).field_2._M_local_buf[0] = '\0';
    (local_30->caption)._M_dataplus._M_p = (pointer)&(local_30->caption).field_2;
    (local_30->caption)._M_string_length = 0;
    (local_30->caption).field_2._M_local_buf[0] = '\0';
    __position._M_current =
         (this->m_aliases).
         super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_aliases).
        super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<xray_re::xr_file_system::path_alias*,std::allocator<xray_re::xr_file_system::path_alias*>>
      ::_M_realloc_insert<xray_re::xr_file_system::path_alias*const&>
                ((vector<xray_re::xr_file_system::path_alias*,std::allocator<xray_re::xr_file_system::path_alias*>>
                  *)this,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      ppppVar1 = &(this->m_aliases).
                  super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppppVar1 = *ppppVar1 + 1;
    }
    std::__cxx11::string::_M_assign((string *)local_30);
    ppVar3 = find_path_alias(this,(root->_M_dataplus)._M_p);
    if (ppVar3 == (path_alias *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_30->root);
      sVar2 = (local_30->root)._M_string_length;
      if ((sVar2 != 0) && ((local_30->root)._M_dataplus._M_p[sVar2 - 1] != '\\')) {
        std::__cxx11::string::push_back((char)&local_30->root);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_30->root);
    }
    std::__cxx11::string::_M_append((char *)&local_30->root,(ulong)(add->_M_dataplus)._M_p);
    sVar2 = (local_30->root)._M_string_length;
    if ((sVar2 != 0) && ((local_30->root)._M_dataplus._M_p[sVar2 - 1] != '\\')) {
      std::__cxx11::string::push_back((char)&local_30->root);
    }
    return local_30;
  }
  __assert_fail("pa == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                ,0x3a,
                "xr_file_system::path_alias *xray_re::xr_file_system::add_path_alias(const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

xr_file_system::path_alias* xr_file_system::add_path_alias(const std::string& path,
		const std::string& root, const std::string& add)
{
	const path_alias* pa = find_path_alias(path.c_str());
	assert(pa == 0);
	if (pa != 0)
		return 0;

	path_alias* new_pa = new path_alias;
	m_aliases.push_back(new_pa);
	new_pa->path = path;
	pa = find_path_alias(root.c_str());
	if (pa) {
		new_pa->root = pa->root;
	} else {
		new_pa->root = root;
		append_path_separator(new_pa->root);
	}
	new_pa->root += add;
	append_path_separator(new_pa->root);
	return new_pa;
}